

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_c.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_C>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps,double *vrho,
               double *vsigma,double *vlapl,double *vtau)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double __x;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar30;
  double dVar31;
  undefined1 auVar29 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar53;
  undefined1 auVar52 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double __x_00;
  double dVar59;
  double dVar60;
  undefined8 in_XMM3_Qb;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  undefined1 auVar79 [16];
  double dVar80;
  double dVar81;
  double __x_01;
  double dVar82;
  double dVar83;
  uint uVar84;
  uint uVar85;
  double dVar86;
  uint uVar87;
  double dVar88;
  double __x_02;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  undefined1 auVar94 [16];
  double dVar95;
  double dVar96;
  double dVar97;
  double __x_03;
  double dVar98;
  double dVar99;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 local_588;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  
  dVar6 = cbrt(rho);
  dVar63 = (2.519842099789747 / dVar6) * 0.9847450218426962;
  dVar33 = SQRT(dVar63);
  dVar7 = dVar33;
  if (dVar63 < 0.0) {
    dVar7 = sqrt(dVar63);
  }
  dVar47 = dVar63 * 0.053425 + 1.0;
  dVar8 = dVar33;
  if (dVar63 < 0.0) {
    dVar8 = sqrt(dVar63);
  }
  dVar8 = dVar8 * dVar8 * dVar8;
  dVar34 = dVar8 * 0.204775;
  dVar54 = 1.5393389262365056 / (dVar6 * dVar6);
  dVar68 = dVar54 * 0.123235;
  dVar81 = dVar7 * 3.79785 + dVar63 * 0.8969 + dVar34 + dVar68;
  dVar88 = 1.0 / dVar6;
  dVar92 = dVar7 + dVar7;
  dVar64 = dVar92 * 0.022225 + 1.0 + dVar63 * 0.03138525;
  dVar71 = 1.0 / (dVar64 * dVar64);
  dVar8 = dVar8 * 0.1100325;
  dVar54 = dVar54 * 0.1241775;
  dVar68 = dVar92 * 1.898925 + dVar63 * 0.8969 + dVar34 + dVar68;
  dVar35 = dVar7 * 5.1785 + dVar63 * 0.905775 + dVar8 + dVar54;
  dVar54 = dVar92 * 2.58925 + dVar63 * 0.905775 + dVar8 + dVar54;
  dVar55 = dVar54 * dVar54;
  __x_03 = 29.608749977793437 / dVar54 + 1.0;
  auVar61._8_8_ = __x_03;
  auVar61._0_8_ = dVar55;
  auVar61 = divpd(_DAT_010020a0,auVar61);
  dVar93 = dVar7 * 0.04445 + 1.0 + dVar63 * 0.03138525;
  dVar95 = rho * rho;
  dVar8 = sigma * sigma;
  dVar34 = dVar95 * dVar95;
  auVar79._8_8_ = dVar88;
  auVar79._0_8_ = 0x3ff0000000000000;
  auVar94._8_8_ = rho;
  auVar94._0_8_ = dVar7;
  auVar79 = divpd(auVar79,auVar94);
  dVar75 = auVar79._0_8_;
  dVar80 = auVar79._8_8_;
  dVar69 = dVar75 + dVar75;
  dVar30 = dVar80 * 1.720508027656199;
  dVar91 = dVar30 * dVar75 * 1.4422495703074083;
  dVar67 = 16.081979498692537 / dVar81 + 1.0;
  dVar72 = (dVar63 * 0.0278125 + 1.0) * 0.0;
  dVar7 = dVar63 * 0.025 + 1.0;
  dVar56 = dVar63 * 0.04445 + 1.0;
  dVar57 = dVar7 * (1.0 / dVar56);
  __x_02 = 16.081979498692537 / dVar68 + 1.0;
  dVar98 = dVar68 * dVar68;
  dVar48 = 1.0 / dVar98;
  dVar92 = 1.0 / __x_02;
  dVar9 = (2.519842099789747 / dVar6) * 4.923725109213481;
  __x_01 = 1.0 / dVar93;
  dVar10 = dVar69 * 0.04445 + 0.125541;
  dVar11 = dVar80 * 2.519842099789747;
  dVar12 = dVar11 * 0.9847450218426962;
  dVar36 = 29.608749977793437 / dVar35 + 1.0;
  local_498._8_8_ = 0x3ff0000000000000;
  local_498._0_8_ = 1.0 / (dVar6 * dVar6);
  dVar6 = log(dVar67);
  dVar13 = log(dVar36);
  dVar49 = dVar72 * dVar13;
  dVar14 = dVar6 * dVar47 * 0.0621814;
  dVar31 = dVar13 * dVar80 * 0.0 * 0.00018311447306006544;
  dVar13 = exp((dVar49 - dVar14) * -3.258891353270929 * 9.869604401089358);
  dVar37 = dVar13 + -1.0;
  dVar15 = log(__x_02);
  if (dVar63 < 0.0) {
    dVar33 = sqrt(dVar63);
  }
  uStack_610 = SUB84(dVar35 * dVar35,0);
  uStack_60c = (undefined4)((ulong)(dVar35 * dVar35) >> 0x20);
  dVar35 = dVar63 * 0.24647 + dVar33 * 1.22865 + dVar69 * 3.79785 + 3.5876;
  dVar16 = dVar35 * dVar92;
  dVar17 = log(__x_03);
  dVar65 = dVar63 * 0.248355 + dVar33 * 0.660195 + dVar69 * 5.1785 + 3.6231;
  local_1a8 = auVar61._0_8_;
  uStack_1a0 = auVar61._8_8_;
  dVar58 = local_1a8 * dVar65 * uStack_1a0;
  dVar38 = dVar72 * 0.5848223622634646 * dVar58 +
           dVar17 * -0.0 +
           -dVar47 * dVar48 * dVar16 + dVar71 * 0.0285764 * dVar10 + dVar15 * 0.01328816518;
  dVar15 = exp(dVar8 * 1.2599210498948732 * -0.031886966904838866 * (dVar88 / (dVar34 * rho)));
  dVar89 = dVar33 * 1.4422495703074083 * dVar30;
  dVar69 = dVar89 * 0.1023875;
  auVar29._8_8_ = dVar37;
  auVar29._0_8_ = dVar95;
  auVar79 = divpd(local_498,auVar29);
  dVar70 = auVar79._0_8_;
  dVar17 = sigma * 0.001 * dVar70 * 0.125 + 2.8712340001881915;
  auVar45._8_8_ = dVar17;
  auVar45._0_8_ = rho;
  auVar61 = divpd(local_498,auVar45);
  dVar73 = auVar61._0_8_;
  dVar76 = dVar73 * 1.5393389262365056 * 0.08215666666666667;
  dVar77 = tau * dVar73 + dVar70 * sigma * -0.125;
  dVar53 = auVar61._8_8_;
  dVar78 = dVar77 * dVar53;
  dVar33 = 0.0;
  if (dVar78 <= 0.0) {
    dVar33 = dVar78;
  }
  if (2.5 < dVar78) {
    local_398 = 1.0 - dVar78;
  }
  else {
    local_398 = -1.5;
  }
  dVar89 = dVar89 * 0.05501625;
  dVar82 = dVar9 * dVar38 + ((dVar14 - __x_01 * 0.0285764) - dVar49) * -0.045;
  auVar2._8_8_ = dVar17 * dVar17;
  auVar2._0_8_ = dVar95 * rho;
  auVar61 = divpd(local_498,auVar2);
  dVar66 = auVar61._0_8_;
  dVar39 = dVar66 * sigma;
  dVar40 = 1.0 - dVar33;
  dVar77 = dVar77 * auVar61._8_8_;
  dVar86 = sigma * 1.5874010519681996 * dVar70;
  dVar83 = (tau * -1.6666666666666667 * dVar70 + dVar39 / 3.0) * dVar53 +
           (sigma * 0.001 * dVar66 * dVar77) / 3.0;
  dVar17 = dVar83;
  if (dVar78 <= 2.5) {
    dVar17 = 0.0;
  }
  auVar3._8_4_ = uStack_610;
  auVar3._0_8_ = dVar36;
  auVar3._12_4_ = uStack_60c;
  auVar61 = divpd(_DAT_010020a0,auVar3);
  dVar36 = dVar75 * 1.2599210498948732 * dVar80 * 0.9847450218426962;
  auVar4._8_8_ = dVar67;
  auVar4._0_8_ = dVar81 * dVar81;
  auVar94 = divpd(_DAT_010020a0,auVar4);
  dVar67 = dVar73 * 1.5393389262365056 * 0.082785;
  dVar81 = 1.0 / dVar40;
  dVar41 = auVar79._8_8_ * 5.173167562432343 * 3.0464738926897783;
  dVar96 = dVar70 * sigma * 0.6269081516456065 * dVar15;
  dVar46 = auVar79._8_8_ * 3.258891353270929;
  dVar32 = dVar82 * dVar46 * 0.043341108700271344;
  __x = dVar32 * dVar96 +
        dVar57 * 0.027439371595564633 * sigma * (dVar88 / dVar95) * 1.2599210498948732 * dVar41 +
        1.0;
  if (__x < 0.0) {
    dVar18 = sqrt(__x);
  }
  else {
    dVar18 = SQRT(__x);
  }
  uStack_550 = auVar61._8_8_;
  __x_00 = dVar86 * 0.00842681926885735 + 1.0;
  if (dVar18 < 0.0) {
    dVar18 = sqrt(dVar18);
  }
  else {
    dVar18 = SQRT(dVar18);
  }
  uVar84 = (uint)((long)((ulong)(2.5 < dVar78) << 0x3f) >> 0x3f);
  uVar85 = (uint)((long)((ulong)(2.5 < dVar78) << 0x3f) >> 0x3f);
  dVar59 = 1.0 - 1.0 / dVar18;
  dVar19 = dVar37 * dVar59 + 1.0;
  dVar20 = log(dVar19);
  dVar21 = exp(dVar33 * -0.64 * dVar81);
  dVar22 = exp(1.5 / local_398);
  dVar23 = exp(__x_01);
  if (__x_00 < 0.0) {
    dVar24 = sqrt(__x_00);
  }
  else {
    dVar24 = SQRT(__x_00);
  }
  uStack_4a0 = (uint)in_XMM3_Qb;
  uStack_49c = (uint)((ulong)in_XMM3_Qb >> 0x20);
  dVar93 = 1.0 / (dVar93 * dVar93);
  dVar6 = dVar6 * dVar12 * 0.0011073470983333333;
  dVar50 = dVar47 * auVar94._0_8_ *
           (((dVar91 * -0.632975 + dVar12 * -0.29896666666666666) - dVar69) - dVar76) *
           auVar94._8_8_;
  local_558 = auVar61._0_8_;
  local_408 = SUB84(dVar83,0);
  uStack_404 = (uint)((ulong)dVar83 >> 0x20);
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  dVar60 = dVar91 * -0.007408333333333334 + dVar12 * -0.01046175;
  dVar76 = ((dVar36 * -1.26595 + dVar12 * -0.29896666666666666) - dVar69) - dVar76;
  uVar87 = ~uVar84 & uStack_404;
  local_3a8 = (double)CONCAT44(uVar87,~uVar84 & local_408);
  uStack_3a0 = CONCAT44(~uVar85 & uStack_49c,~uVar85 & uStack_4a0);
  uStack_5f0 = (ulong)(uVar85 & 0x40040000) << 0x20;
  dVar51 = 1.0 - 1.0 / dVar24;
  dVar69 = (dVar23 + -1.0) * dVar51 + 1.0;
  dVar83 = log(dVar69);
  if (dVar63 < 0.0) {
    dVar25 = sqrt(dVar63);
  }
  else {
    dVar25 = SQRT(dVar63);
  }
  dVar26 = (1.0 / (dVar68 * dVar98)) * dVar47;
  dVar27 = 1.0 / (dVar37 * dVar37);
  dVar91 = local_558 *
           uStack_550 * (((dVar91 * -0.8630833333333333 + dVar12 * -0.301925) - dVar89) - dVar67) *
           dVar72 * 0.5848223622634646;
  dVar77 = dVar70 * -0.001 * dVar77 * 0.125 - dVar70 * dVar53 * 0.125;
  dVar68 = 0.0;
  if (dVar78 <= 0.0) {
    dVar68 = dVar77;
  }
  dVar42 = (dVar88 / dVar95) * 1.2599210498948732;
  local_588._0_4_ = (uint)-(ulong)(0.0 < dVar78);
  local_588._4_4_ = (uint)(-(ulong)(0.0 < dVar78) >> 0x20);
  local_588 = (double)CONCAT44(~local_588._4_4_ & uStack_404,~(uint)local_588 & local_408);
  dVar43 = ((dVar6 + dVar50) - dVar31) - dVar91;
  dVar5 = (double)CONCAT44(uVar87,~uVar85 & uStack_4a0);
  if (2.5 < dVar78) {
    dVar44 = 0.0;
    dVar28 = dVar77;
  }
  else {
    dVar28 = 0.0;
    dVar44 = dVar77;
  }
  dVar77 = dVar93 * dVar60;
  dVar97 = dVar33 * (1.0 / (dVar40 * dVar40)) * -0.64;
  dVar40 = dVar5 * dVar5;
  dVar73 = dVar73 * dVar53;
  dVar33 = 0.0;
  if (dVar78 <= 2.5) {
    dVar33 = dVar73;
  }
  local_198 = -dVar77;
  dVar67 = ((dVar36 * -1.7261666666666666 + dVar12 * -0.301925) - dVar89) - dVar67;
  dVar90 = (1.0 / (local_398 * local_398)) * -1.05;
  bVar1 = dVar78 <= 2.5;
  dVar74 = dVar40 * (double)(uStack_5f0 | uStack_3a0);
  dVar89 = dVar40 * dVar40;
  dVar53 = dVar89 * (double)(uStack_5f0 | uStack_3a0);
  dVar99 = dVar89 * dVar40 * -0.362942158544;
  if (bVar1) {
    local_488 = dVar53 * dVar44 * 3.101306810232 +
                dVar89 * dVar44 * -9.57855118103 +
                dVar74 * dVar44 * 12.2462410087 +
                dVar40 * dVar44 * -4.607056813647 + dVar44 * -0.64 + dVar5 * dVar44 * -0.8704 +
                dVar99 * dVar44;
  }
  else {
    local_488 = dVar28 * dVar90 * dVar22;
  }
  dVar28 = dVar80 * 0.9847450218426962 * (dVar75 / dVar63) * 1.2599210498948732;
  dVar37 = dVar37 * ((1.0 / dVar18) / __x);
  if (bVar1) {
    local_5e8 = dVar53 * dVar33 * 3.101306810232 +
                dVar89 * dVar33 * -9.57855118103 +
                dVar74 * dVar33 * 12.2462410087 +
                dVar40 * dVar33 * -4.607056813647 + dVar33 * -0.64 + dVar5 * dVar33 * -0.8704 +
                dVar99 * dVar33;
  }
  else {
    local_5e8 = (double)(-(ulong)(2.5 < dVar78) & (ulong)dVar73) * dVar90 * dVar22;
  }
  dVar30 = (1.0 / dVar25) * 1.4422495703074083 * dVar30;
  dVar19 = 1.0 / dVar19;
  dVar7 = (dVar43 * 3.258891353270929 * -9.869604401089358 * dVar13 * dVar59 +
          (dVar46 * 0.005821825775391099 * dVar8 * sigma * dVar82 *
           (1.0 / (dVar34 * dVar34 * rho)) * dVar15 +
          dVar82 * dVar46 * -0.11557628986739024 * dVar39 * 0.6269081516456065 * dVar15 +
          ((dVar31 + ((dVar93 * 0.0285764 * dVar60 - dVar6) - dVar50) + dVar91) * -0.045 +
          dVar11 * -1.6412417030711604 * dVar38 +
          dVar9 * (dVar72 * 17.315859105681465 * (1.0 / (dVar55 * dVar55)) * dVar65 *
                   (1.0 / (__x_03 * __x_03)) * dVar67 +
                  dVar72 * 0.5848223622634646 *
                  (dVar12 * -0.082785 + dVar28 * 3.4523333333333333 + dVar30 * -0.1100325) *
                  local_1a8 * uStack_1a0 +
                  dVar72 * -1.1696447245269292 * (1.0 / (dVar54 * dVar55)) * dVar65 *
                  uStack_1a0 * dVar67 +
                  dVar11 * -0.0 * dVar58 +
                  local_1a8 * 0.0 * dVar67 * uStack_1a0 +
                  dVar47 * (1.0 / (dVar98 * dVar98)) * -16.081979498692537 *
                  dVar35 * (1.0 / (__x_02 * __x_02)) * dVar76 +
                  -dVar47 * dVar48 *
                  dVar92 * (dVar12 * -0.08215666666666667 + dVar28 * 2.5319 + dVar30 * -0.204775) +
                  (dVar26 + dVar26) * dVar16 * dVar76 +
                  dVar48 * dVar80 * 0.044189633301733915 * dVar16 +
                  dVar48 * -0.2137 * dVar76 * dVar92 +
                  (dVar71 / dVar64) * -0.0571528 *
                  dVar10 * (dVar36 * -0.014816666666666667 + dVar12 * -0.01046175) +
                  (dVar75 / dVar63) * 1.4422495703074083 *
                  dVar71 * 1.2599210498948732 * 0.0008468139866666666 * 0.6827840632552955 * dVar80)
          ) * dVar46 * 0.043341108700271344 * dVar96 +
          dVar27 * dVar82 * 0.3949273883044934 * 10.620372852424028 * 0.043341108700271344 *
          dVar86 * dVar15 * dVar43 * dVar13 * 9.869604401089358 +
          dVar57 * sigma * dVar42 * 2.080083823051904 * 0.027439371595564633 *
          dVar13 * 9.869604401089358 * dVar27 * dVar43 * 24.6912485886901 +
          (dVar88 / (dVar95 * rho)) * dVar57 * 0.0640252003896508 * sigma * -1.2599210498948732 *
          dVar41 + dVar66 * (1.0 / dVar56) * -0.002743937159556463 * sigma *
                   dVar46 * 1.2599210498948732 +
                   dVar7 * (1.0 / (dVar56 * dVar56)) * 0.004878720269691391 * dVar39 *
                   dVar46 * 1.2599210498948732) * dVar37 * 0.25) * 0.0310906908696549 * dVar19;
  uVar84 = (uint)bVar1;
  auVar62._0_8_ = CONCAT44((int)(uVar84 << 0x1f) >> 0x1f,(int)(uVar84 << 0x1f) >> 0x1f);
  auVar62._8_4_ = (int)(uVar84 << 0x1f) >> 0x1f;
  auVar62._12_4_ = (int)(uVar84 << 0x1f) >> 0x1f;
  bVar1 = dVar78 <= 0.0;
  uVar84 = (uint)bVar1;
  auVar52._0_8_ = CONCAT44((int)(uVar84 << 0x1f) >> 0x1f,(int)(uVar84 << 0x1f) >> 0x1f);
  auVar52._8_4_ = (int)(uVar84 << 0x1f) >> 0x1f;
  auVar52._12_4_ = (int)(uVar84 << 0x1f) >> 0x1f;
  dVar33 = (double)(~auVar52._8_8_ &
                    (~auVar62._8_8_ & (ulong)(dVar22 * -0.7) |
                    (ulong)(dVar89 * -0.051848879792 * dVar74 +
                           dVar89 * dVar40 * 0.516884468372 +
                           dVar53 * -1.915710236206 +
                           dVar89 * 3.061560252175 +
                           dVar74 * -1.535685604549 + dVar40 * -0.4352 + dVar5 * -0.64 + 1.0) &
                    auVar62._8_8_) | (ulong)dVar21 & auVar52._8_8_);
  dVar63 = (dVar23 + -1.0) * ((1.0 / dVar24) / __x_00);
  dVar69 = 1.0 / dVar69;
  dVar47 = ((dVar14 + __x_01 * -0.0285764 + dVar83 * 0.0285764) - dVar49) -
           dVar20 * 0.0310906908696549;
  dVar8 = dVar37 * 0.0310906908696549 *
          (dVar8 * dVar46 * -0.002183184665771662 * dVar82 * (1.0 / (dVar34 * dVar34)) * dVar15 +
          dVar42 * dVar57 * 0.027439371595564633 * dVar41 +
          dVar15 * dVar70 * 1.5874010519681996 * 0.3949273883044934 * dVar32) * dVar19 * 0.25;
  if (bVar1) {
    local_488 = (dVar68 * -0.64 * dVar81 + dVar68 * dVar97) * dVar21;
  }
  if (bVar1) {
    dVar73 = (double)(~-(ulong)(0.0 < dVar78) & (ulong)dVar73);
    local_5e8 = dVar21 * (dVar73 * -0.64 * dVar81 + dVar73 * dVar97);
  }
  dVar34 = (dVar49 - dVar14) + dVar20 * 0.0310906908696549 + dVar33 * dVar47;
  *eps = dVar34;
  *vrho = (dVar33 * ((dVar31 + (((dVar77 * 0.0285764 +
                                 (local_198 * dVar23 * dVar51 +
                                 dVar39 * dVar63 * 1.8171205928321397 * 0.014225094736250906 *
                                          -0.34500085141213216) * 0.0285764 * dVar69) - dVar6) -
                               dVar50) + dVar91) - dVar7) +
          dVar43 + dVar7 +
          (double)(~auVar52._0_8_ &
                   (~auVar62._0_8_ & (ulong)(dVar22 * dVar17 * dVar90) |
                   (ulong)(dVar99 * local_3a8 +
                          dVar53 * local_3a8 * 3.101306810232 +
                          dVar89 * local_3a8 * -9.57855118103 +
                          dVar74 * local_3a8 * 12.2462410087 +
                          dVar40 * local_3a8 * -4.607056813647 +
                          local_3a8 * -0.64 + dVar5 * local_3a8 * -0.8704) & auVar62._0_8_) |
                  (ulong)((local_588 * -0.64 * dVar81 + local_588 * dVar97) * dVar21) &
                  auVar52._0_8_) * dVar47) * rho + dVar34;
  *vsigma = (dVar8 + local_488 * dVar47 +
            (dVar70 * 1.5874010519681996 * dVar63 * 0.3949273883044934 * 0.00015243824895787514 *
             dVar69 - dVar8) * dVar33) * rho;
  *vlapl = 0.0;
  *vtau = local_5e8 * rho * dVar47;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps, double& vrho, double& vsigma, double& vlapl, double& vtau ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_one_ov_pi;
    constexpr double t6 = constants::m_cbrt_4;
    constexpr double t40 = constants::m_cbrt_2;
    constexpr double t61 = constants::m_pi_sq;
    constexpr double t175 = constants::m_cbrt_6;
    constexpr double t176 = constants::m_cbrt_pi_sq;
    constexpr double t5 = t2 * t4;
    constexpr double t7 = t6 * t6;
    constexpr double t19 = t2 * t2;
    constexpr double t20 = t4 * t4;
    constexpr double t21 = t19 * t20;
    constexpr double t41 = t40 - 0.1e1;
    constexpr double t43 = 0.1e1 / t41 / 0.2e1;
    constexpr double t90 = 0.1e1 / t4;
    constexpr double t177 = t176 * t176;
    constexpr double t178 = 0.1e1 / t177;
    constexpr double t179 = t175 * t178;
    constexpr double t180 = t40 * t40;
    constexpr double t181 = t179 * t180;
    constexpr double t185 = t175 * t175;
    constexpr double t187 = 0.1e1 / t176 / t61;
    constexpr double t188 = t185 * t187;
    constexpr double t288 = t4 * t7;
    constexpr double t363 = t90 * t6;
    constexpr double t416 = t5 * t7;
    constexpr double t577 = t178 * t180;
    constexpr double t594 = t19 * t90;


    const double t8 = safe_math::cbrt( rho );
    const double t10 = t7 / t8;
    const double t11 = t5 * t10;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t16 = 0.8969e0 * t11;
    const double t17 = pow_3_2( t11 );
    const double t18 = 0.204775e0 * t17;
    const double t22 = t8 * t8;
    const double t25 = t21 * t6 / t22;
    const double t26 = 0.123235e0 * t25;
    const double t27 = 0.379785e1 * t14 + t16 + t18 + t26;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = 0.1e1 <= zeta_tol;
    const double t35 = safe_math::cbrt( zeta_tol );
    const double t37 = piecewise_functor_3( t34, t35 * zeta_tol, 1.0 );
    const double t39 = 0.2e1 * t37 - 0.2e1;
    const double t44 = t39 * t43;
    const double t46 = 0.1e1 + 0.278125e-1 * t11;
    const double t48 = 0.905775e0 * t11;
    const double t49 = 0.1100325e0 * t17;
    const double t50 = 0.1241775e0 * t25;
    const double t51 = 0.51785e1 * t14 + t48 + t49 + t50;
    const double t54 = 0.1e1 + 0.29608749977793437516e2 / t51;
    const double t55 = safe_math::log( t54 );
    const double t58 = 0.19751673498613801407e-1 * t44 * t46 * t55;
    const double t59 = safe_math::log( 0.2e1 );
    const double t60 = 0.1e1 - t59;
    const double t63 = t60 / t61;
    const double t64 = t35 * t35;
    const double t65 = piecewise_functor_3( t34, t64, 1.0 );
    const double t66 = t65 * t65;
    const double t67 = t66 * t65;
    const double t69 = 0.1e1 / t60;
    const double t71 = 0.1e1 / t67;
    const double t72 = t61 * t71;
    const double t74 = safe_math::exp( -( -t33 + t58 ) * t69 * t72 );
    const double t75 = t74 - 0.1e1;
    const double t77 = 0.1e1 + 0.25e-1 * t11;
    const double t79 = 0.1e1 + 0.4445e-1 * t11;
    const double t80 = 0.1e1 / t79;
    const double t81 = t77 * t80;
    const double t82 = rho * rho;
    const double t84 = 0.1e1 / t8 / t82;
    const double t88 = 0.1e1 / t66;
    const double t93 = 0.1e1 / t75;
    const double t94 = t6 * t69 * t93;
    const double t95 = t88 * t19 * t90 * t94;
    const double t99 = piecewise_functor_3( t34, t64 * zeta_tol, 1.0 );
    const double t100 = 0.1e1 / t99;
    const double t101 = t69 * t100;
    const double t102 = t71 * t93;
    const double t103 = safe_math::sqrt( 0.4e1 );
    const double t104 = t103 * t14;
    const double t106 = 0.3138525e-1 * t11;
    const double t107 = 0.1e1 + 0.22225e-1 * t104 + t106;
    const double t108 = t107 * t107;
    const double t113 = 0.1e1 - 0.2363e1 * t41 * t39 * t43;
    const double t114 = 0.1e1 / t108 * t113;
    const double t115 = 0.1e1 / t14;
    const double t116 = t103 * t115;
    const double t118 = 0.4445e-1 * t116 + 0.125541e0;
    const double t122 = 0.1898925e1 * t104 + t16 + t18 + t26;
    const double t125 = 0.1e1 + 0.16081979498692535067e2 / t122;
    const double t126 = safe_math::log( t125 );
    const double t128 = t122 * t122;
    const double t129 = 0.1e1 / t128;
    const double t130 = t13 * t129;
    const double t132 = safe_math::sqrt( t11 );
    const double t135 = 0.379785e1 * t116 + 0.35876e1 + 0.122865e1 * t132 + 0.24647e0 * t11;
    const double t136 = 0.1e1 / t125;
    const double t137 = t135 * t136;
    const double t141 = 0.258925e1 * t104 + t48 + t49 + t50;
    const double t144 = 0.1e1 + 0.29608749977793437516e2 / t141;
    const double t145 = safe_math::log( t144 );
    const double t148 = t44 * t46;
    const double t149 = t141 * t141;
    const double t150 = 0.1e1 / t149;
    const double t154 = 0.51785e1 * t116 + 0.36231e1 + 0.660195e0 * t132 + 0.248355e0 * t11;
    const double t156 = 0.1e1 / t144;
    const double t157 = t150 * t154 * t156;
    const double t160 = 0.285764e-1 * t114 * t118 + 0.1328816518e-1 * t126 - 0.1e1 * t130 * t137 - 0.21973736767207854065e-2 * t44 * t145 + 0.5848223622634646207e0 * t148 * t157;
    const double t165 = 0.1e1 + 0.4445e-1 * t14 + t106;
    const double t166 = 0.1e1 / t165;
    const double t172 = 0.5e1 * t5 * t10 * t160 - 0.45e2 * eta * ( -0.285764e-1 * t166 * t113 + t33 - t58 );
    const double t174 = t101 * t102 * t172;
    const double t183 = 0.1e1 / t22 / t82;
    const double t184 = sigma * t183;
    const double t189 = sigma * sigma;
    const double t190 = t40 * t189;
    const double t191 = t82 * t82;
    const double t192 = t191 * rho;
    const double t194 = 0.1e1 / t8 / t192;
    const double t198 = safe_math::exp( -0.20444604078896369094e0 * t188 * t190 * t194 );
    const double t200 = t181 * t184 * t198;
    const double t203 = 0.1e1 + 0.27439371595564631661e-1 * t81 * sigma * t84 * t40 * t95 + 0.43341108700271342816e-1 * t174 * t200;
    const double t204 = pow_1_4( t203 );
    const double t206 = 0.1e1 - 0.1e1 / t204;
    const double t208 = t75 * t206 + 0.1e1;
    const double t209 = safe_math::log( t208 );
    const double t211 = t63 * t67 * t209;
    const double t213 = 0.1e1 / t22 / rho;
    const double t216 = tau * t213 - t184 / 0.8e1;
    const double t220 = eta * sigma;
    const double t223 = 0.3e1 / 0.2e2 * t185 * t177 * t40 + t220 * t183 / 0.8e1;
    const double t224 = 0.1e1 / t223;
    const double t225 = t216 * t224;
    const double t226 = t225 <= 0.e0;
    const double t227 = 0.e0 < t225;
    const double t228 = piecewise_functor_3( t227, 0.0, t225 );
    const double t229 = 0.1e1 - t228;
    const double t230 = 0.1e1 / t229;
    const double t233 = safe_math::exp( -0.64e0 * t228 * t230 );
    const double t234 = t225 <= 0.25e1;
    const double t235 = 0.25e1 < t225;
    const double t236 = piecewise_functor_3( t235, 0.25e1, t225 );
    const double t238 = t236 * t236;
    const double t240 = t238 * t236;
    const double t242 = t238 * t238;
    const double t244 = t242 * t236;
    const double t246 = t242 * t238;
    const double t251 = piecewise_functor_3( t235, t225, 0.25e1 );
    const double t252 = 0.1e1 - t251;
    const double t255 = safe_math::exp( 0.15e1 / t252 );
    const double t257 = piecewise_functor_5( t226, t233, t234, 0.1e1 - 0.64e0 * t236 - 0.4352e0 * t238 - 0.1535685604549e1 * t240 + 0.3061560252175e1 * t242 - 0.1915710236206e1 * t244 + 0.516884468372e0 * t246 - 0.51848879792e-1 * t242 * t240, -0.7e0 * t255 );
    const double t260 = safe_math::exp( 0.1e1 * t166 );
    const double t261 = t260 - 0.1e1;
    const double t262 = t180 * sigma;
    const double t263 = t262 * t183;
    const double t266 = 0.1e1 + 0.21337642104376358333e-1 * t179 * t263;
    const double t267 = pow_1_4( t266 );
    const double t269 = 0.1e1 - 0.1e1 / t267;
    const double t271 = t261 * t269 + 0.1e1;
    const double t272 = safe_math::log( t271 );
    const double t276 = ( -0.285764e-1 * t166 + 0.285764e-1 * t272 ) * t113 + t33 - t58 - t211;
    const double t277 = t257 * t276;
    const double t279 = 0.1e1 / t8 / rho;
    const double t280 = t7 * t279;
    const double t282 = t5 * t280 * t31;
    const double t283 = 0.11073470983333333333e-2 * t282;
    const double t284 = t27 * t27;
    const double t285 = 0.1e1 / t284;
    const double t286 = t13 * t285;
    const double t287 = t115 * t2;
    const double t289 = t288 * t279;
    const double t290 = t287 * t289;
    const double t292 = t5 * t280;
    const double t293 = 0.29896666666666666667e0 * t292;
    const double t294 = t132 * t2;
    const double t295 = t294 * t289;
    const double t296 = 0.1023875e0 * t295;
    const double t298 = t21 * t6 * t213;
    const double t299 = 0.82156666666666666667e-1 * t298;
    const double t300 = -0.632975e0 * t290 - t293 - t296 - t299;
    const double t301 = 0.1e1 / t30;
    const double t302 = t300 * t301;
    const double t303 = t286 * t302;
    const double t304 = 0.1e1 * t303;
    const double t305 = t44 * t2;
    const double t308 = t305 * t288 * t279 * t55;
    const double t309 = 0.18311447306006545054e-3 * t308;
    const double t310 = t51 * t51;
    const double t311 = 0.1e1 / t310;
    const double t313 = 0.301925e0 * t292;
    const double t314 = 0.5501625e-1 * t295;
    const double t315 = 0.82785e-1 * t298;
    const double t316 = -0.86308333333333333334e0 * t290 - t313 - t314 - t315;
    const double t318 = 0.1e1 / t54;
    const double t319 = t311 * t316 * t318;
    const double t320 = t148 * t319;
    const double t321 = 0.5848223622634646207e0 * t320;
    const double t322 = t283 + t304 - t309 - t321;
    const double t323 = t322 * t69;
    const double t324 = t323 * t61;
    const double t325 = t71 * t74;
    const double t326 = t325 * t206;
    const double t329 = 0.1e1 / t204 / t203;
    const double t330 = t75 * t329;
    const double t331 = t82 * rho;
    const double t333 = 0.1e1 / t22 / t331;
    const double t334 = t333 * t80;
    const double t336 = t40 * t88;
    const double t337 = t69 * t93;
    const double t338 = t336 * t337;
    const double t341 = t79 * t79;
    const double t342 = 0.1e1 / t341;
    const double t343 = t77 * t342;
    const double t344 = sigma * t333;
    const double t349 = 0.1e1 / t8 / t331;
    const double t355 = t81 * sigma;
    const double t356 = t84 * t40;
    const double t357 = t66 * t66;
    const double t359 = 0.1e1 / t357 / t65;
    const double t360 = t359 * t19;
    const double t362 = t355 * t356 * t360;
    const double t364 = t60 * t60;
    const double t365 = 0.1e1 / t364;
    const double t366 = t363 * t365;
    const double t367 = t75 * t75;
    const double t368 = 0.1e1 / t367;
    const double t369 = t368 * t322;
    const double t370 = t61 * t74;
    const double t372 = t366 * t369 * t370;
    const double t375 = t365 * t100;
    const double t376 = t357 * t66;
    const double t377 = 0.1e1 / t376;
    const double t378 = t375 * t377;
    const double t379 = t368 * t172;
    const double t380 = t379 * t179;
    const double t381 = t378 * t380;
    const double t382 = t198 * t322;
    const double t383 = t382 * t370;
    const double t384 = t263 * t383;
    const double t392 = 0.1e1 / t108 / t107 * t113;
    const double t393 = safe_math::pow( 0.4e1, 0.1e1 / 0.6e1 );
    const double t394 = t393 * t115;
    const double t395 = t5 * t279;
    const double t396 = t394 * t395;
    const double t398 = 0.1046175e-1 * t292;
    const double t399 = -0.14816666666666666667e-1 * t396 - t398;
    const double t400 = t118 * t399;
    const double t403 = t114 * t393;
    const double t405 = 0.1e1 / t14 / t11;
    const double t406 = t405 * t2;
    const double t412 = -0.126595e1 * t396 - t293 - t296 - t299;
    const double t417 = t279 * t129;
    const double t421 = t128 * t122;
    const double t422 = 0.1e1 / t421;
    const double t423 = t13 * t422;
    const double t427 = t393 * t405;
    const double t428 = t427 * t395;
    const double t430 = 0.1e1/safe_math::sqrt( t11 );
    const double t431 = t430 * t2;
    const double t432 = t431 * t289;
    const double t435 = 0.25319e1 * t428 - 0.204775e0 * t432 - 0.82156666666666666667e-1 * t292;
    const double t436 = t435 * t136;
    const double t439 = t128 * t128;
    const double t440 = 0.1e1 / t439;
    const double t441 = t13 * t440;
    const double t442 = t125 * t125;
    const double t443 = 0.1e1 / t442;
    const double t444 = t135 * t443;
    const double t449 = -0.17261666666666666667e1 * t396 - t313 - t314 - t315;
    const double t454 = t44 * t5;
    const double t458 = t149 * t141;
    const double t459 = 0.1e1 / t458;
    const double t460 = t459 * t154;
    const double t461 = t156 * t449;
    const double t468 = 0.34523333333333333333e1 * t428 - 0.1100325e0 * t432 - 0.82785e-1 * t292;
    const double t470 = t150 * t468 * t156;
    const double t473 = t149 * t149;
    const double t474 = 0.1e1 / t473;
    const double t475 = t474 * t154;
    const double t476 = t144 * t144;
    const double t477 = 0.1e1 / t476;
    const double t478 = t477 * t449;
    const double t482 = -0.571528e-1 * t392 * t400 + 0.84681398666666666666e-3 * t403 * t406 * t4 * t279 - 0.2137e0 * t129 * t412 * t136 + 0.17808333333333333333e-1 * t416 * t417 * t137 + 0.2e1 * t423 * t137 * t412 - 0.1e1 * t130 * t436 - 0.16081979498692535067e2 * t441 * t444 * t412 + 0.65061487801810439052e-1 * t44 * t150 * t449 * t156 - 0.54217906501508699211e-2 * t454 * t280 * t157 - 0.11696447245269292414e1 * t148 * t460 * t461 + 0.5848223622634646207e0 * t148 * t470 + 0.17315859105681463759e2 * t148 * t475 * t478;
    const double t486 = t165 * t165;
    const double t487 = 0.1e1 / t486;
    const double t488 = t487 * t113;
    const double t490 = -0.74083333333333333333e-2 * t290 - t398;
    const double t496 = -0.5e1 / 0.3e1 * t5 * t280 * t160 + 0.5e1 * t5 * t10 * t482 - 0.45e2 * eta * ( 0.285764e-1 * t488 * t490 - t283 - t304 + t309 + t321 );
    const double t498 = t101 * t102 * t496;
    const double t502 = t181 * t344 * t198;
    const double t505 = t101 * t102;
    const double t506 = t189 * sigma;
    const double t507 = t172 * t506;
    const double t508 = t191 * t191;
    const double t509 = t508 * rho;
    const double t510 = 0.1e1 / t509;
    const double t511 = t510 * t198;
    const double t515 = -0.27439371595564631661e-2 * t334 * sigma * t338 + 0.48787202696913915093e-2 * t343 * t344 * t338 - 0.64025200389650807209e-1 * t81 * sigma * t349 * t40 * t95 + 0.27439371595564631661e-1 * t362 * t372 + 0.43341108700271342816e-1 * t381 * t384 + 0.43341108700271342816e-1 * t498 * t200 - 0.11557628986739024751e0 * t174 * t502 + 0.58218257753910989057e-2 * t505 * t507 * t511;
    const double t518 = -t324 * t326 + t330 * t515 / 0.4e1;
    const double t520 = 0.1e1 / t208;
    const double t522 = t63 * t67 * t518 * t520;
    const double t526 = -0.5e1 / 0.3e1 * tau * t183 + t344 / 0.3e1;
    const double t528 = t223 * t223;
    const double t529 = 0.1e1 / t528;
    const double t530 = t216 * t529;
    const double t531 = t220 * t333;
    const double t534 = t526 * t224 + t530 * t531 / 0.3e1;
    const double t535 = piecewise_functor_3( t227, 0.0, t534 );
    const double t538 = t229 * t229;
    const double t539 = 0.1e1 / t538;
    const double t540 = t228 * t539;
    const double t543 = -0.64e0 * t535 * t230 - 0.64e0 * t540 * t535;
    const double t544 = t543 * t233;
    const double t545 = piecewise_functor_3( t235, 0.0, t534 );
    const double t547 = t236 * t545;
    const double t549 = t238 * t545;
    const double t551 = t240 * t545;
    const double t553 = t242 * t545;
    const double t555 = t244 * t545;
    const double t560 = t252 * t252;
    const double t561 = 0.1e1 / t560;
    const double t562 = piecewise_functor_3( t235, t534, 0.0 );
    const double t566 = piecewise_functor_5( t226, t544, t234, -0.64e0 * t545 - 0.8704e0 * t547 - 0.4607056813647e1 * t549 + 0.122462410087e2 * t551 - 0.957855118103e1 * t553 + 0.3101306810232e1 * t555 - 0.362942158544e0 * t246 * t545, -0.105e1 * t561 * t562 * t255 );
    const double t567 = t566 * t276;
    const double t568 = t487 * t490;
    const double t570 = t260 * t269;
    const double t574 = 0.1e1 / t267 / t266;
    const double t575 = t261 * t574;
    const double t576 = t575 * t175;
    const double t581 = -0.1e1 * t568 * t570 - 0.14225094736250905555e-1 * t576 * t577 * t344;
    const double t582 = 0.1e1 / t271;
    const double t587 = ( 0.285764e-1 * t568 + 0.285764e-1 * t581 * t582 ) * t113 - t283 - t304 + t309 + t321 - t522;
    const double t588 = t257 * t587;
    const double t591 = t63 * t67;
    const double t595 = t594 * t94;
    const double t598 = t180 * t183;
    const double t599 = t598 * t198;
    const double t600 = t179 * t599;
    const double t604 = 0.1e1 / t508;
    const double t605 = t604 * t198;
    const double t609 = 0.27439371595564631661e-1 * t81 * t356 * t88 * t595 + 0.43341108700271342816e-1 * t174 * t600 - 0.21831846657716620896e-2 * t505 * t172 * t189 * t605;
    const double t610 = t609 * t520;
    const double t613 = t591 * t330 * t610 / 0.4e1;
    const double t614 = t183 * t224;
    const double t615 = eta * t183;
    const double t618 = -t530 * t615 / 0.8e1 - t614 / 0.8e1;
    const double t619 = piecewise_functor_3( t227, 0.0, t618 );
    const double t624 = -0.64e0 * t619 * t230 - 0.64e0 * t540 * t619;
    const double t625 = t624 * t233;
    const double t626 = piecewise_functor_3( t235, 0.0, t618 );
    const double t628 = t236 * t626;
    const double t630 = t238 * t626;
    const double t632 = t240 * t626;
    const double t634 = t242 * t626;
    const double t636 = t244 * t626;
    const double t641 = piecewise_functor_3( t235, t618, 0.0 );
    const double t645 = piecewise_functor_5( t226, t625, t234, -0.64e0 * t626 - 0.8704e0 * t628 - 0.4607056813647e1 * t630 + 0.122462410087e2 * t632 - 0.957855118103e1 * t634 + 0.3101306810232e1 * t636 - 0.362942158544e0 * t246 * t626, -0.105e1 * t561 * t641 * t255 );
    const double t646 = t645 * t276;
    const double t647 = t575 * t179;
    const double t648 = t582 * t113;
    const double t652 = 0.15243824895787514157e-3 * t647 * t598 * t648 - t613;
    const double t653 = t257 * t652;
    const double t655 = t213 * t224;
    const double t656 = piecewise_functor_3( t227, 0.0, t655 );
    const double t661 = -0.64e0 * t656 * t230 - 0.64e0 * t540 * t656;
    const double t662 = t661 * t233;
    const double t663 = piecewise_functor_3( t235, 0.0, t655 );
    const double t665 = t236 * t663;
    const double t667 = t238 * t663;
    const double t669 = t240 * t663;
    const double t671 = t242 * t663;
    const double t673 = t244 * t663;
    const double t678 = piecewise_functor_3( t235, t655, 0.0 );
    const double t682 = piecewise_functor_5( t226, t662, t234, -0.64e0 * t663 - 0.8704e0 * t665 - 0.4607056813647e1 * t667 + 0.122462410087e2 * t669 - 0.957855118103e1 * t671 + 0.3101306810232e1 * t673 - 0.362942158544e0 * t246 * t663, -0.105e1 * t561 * t678 * t255 );
    const double t683 = rho * t682;


    eps = -t33 + t58 + t211 + t277;
    vrho = -t33 + t58 + t211 + t277 + rho * ( t283 + t304 - t309 - t321 + t522 + t567 + t588 );
    vsigma = rho * ( t613 + t646 + t653 );
    vlapl = 0.e0;
    vtau = t683 * t276;

  }